

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O3

int main(void)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  size_t written_1;
  char *bech32;
  char *blech32_1;
  size_t written;
  char *blech32;
  uchar pub_key [33];
  long local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8 [6];
  char *local_b8 [6];
  char *local_88 [13];
  
  local_e8[0] = (char *)0x0;
  local_b8[0] = (char *)0x0;
  iVar2 = wally_hex_to_bytes("03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
                             local_88,0x21);
  if ((iVar2 == 0) && (local_e8[0] == (char *)0x21)) {
    iVar2 = wally_confidential_addr_from_addr_segwit
                      ("ert1qu6ssk77c466kg3x9wd82dqkd9udddykyfykm9k","ert","el",local_88,0x21,
                       local_b8);
    pcVar1 = local_b8[0];
    if (iVar2 != 0) goto LAB_00101289;
    iVar2 = strncmp(local_b8[0],
                    "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqpe4ppdaa3t44v3zv2u6w56pv6tc666fvgzaclqjnkz0sd"
                    ,0x66);
    wally_free_string(pcVar1);
    if (iVar2 != 0) goto LAB_00101289;
    uVar3 = 1;
  }
  else {
LAB_00101289:
    puts("check_confidential_addr_from_addr_segwit(pubkey) test failed!");
    uVar3 = 0;
  }
  local_100 = 0;
  local_f0 = (char *)0x0;
  local_f8 = (char *)0x0;
  iVar2 = wally_hex_to_bytes("03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
                             local_b8,0x21);
  if ((iVar2 == 0) && (local_100 == 0x21)) {
    iVar2 = wally_hex_to_bytes("0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6"
                               ,local_e8,0x22,&local_100);
    if ((iVar2 != 0) || (local_100 != 0x22)) goto LAB_001013b7;
    iVar2 = wally_addr_segwit_from_bytes(local_e8,0x22,"ert",0,&local_f8);
    pcVar1 = local_f8;
    if (iVar2 != 0) goto LAB_001013b7;
    strcpy((char *)local_88,local_f8);
    wally_free_string(pcVar1);
    iVar2 = bcmp(local_88,"ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",0x40);
    if (iVar2 != 0) goto LAB_001013b7;
    iVar2 = wally_confidential_addr_from_addr_segwit(local_88,"ert","el",local_b8,0x21,&local_f0);
    pcVar1 = local_f0;
    if (iVar2 != 0) goto LAB_001013b7;
    iVar2 = strncmp(local_f0,
                    "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
                    ,0x79);
    wally_free_string(pcVar1);
    if (iVar2 != 0) goto LAB_001013b7;
  }
  else {
LAB_001013b7:
    puts("check_confidential_addr_from_addr_segwit(script) test failed!");
    uVar3 = 0;
  }
  local_88[0] = (char *)0x0;
  iVar2 = wally_confidential_addr_to_addr_segwit
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqpe4ppdaa3t44v3zv2u6w56pv6tc666fvgzaclqjnkz0sd"
                     ,"el","ert");
  pcVar1 = local_88[0];
  if (iVar2 == 0) {
    iVar2 = strcmp(local_88[0],"ert1qu6ssk77c466kg3x9wd82dqkd9udddykyfykm9k");
    wally_free_string(pcVar1);
    if (iVar2 != 0) goto LAB_00101417;
  }
  else {
LAB_00101417:
    puts("check_confidential_addr_to_addr_segwit(pubkey) test failed!");
    uVar3 = 0;
  }
  local_88[0] = (char *)0x0;
  iVar2 = wally_confidential_addr_to_addr_segwit
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
                     ,"el","ert");
  pcVar1 = local_88[0];
  if (iVar2 == 0) {
    iVar2 = strcmp(local_88[0],"ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g");
    wally_free_string(pcVar1);
    if (iVar2 != 0) goto LAB_00101477;
  }
  else {
LAB_00101477:
    puts("check_confidential_addr_to_addr_segwit(script) test failed!");
    uVar3 = 0;
  }
  local_e8[0] = (char *)0x0;
  iVar2 = wally_confidential_addr_segwit_to_ec_public_key
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqpe4ppdaa3t44v3zv2u6w56pv6tc666fvgzaclqjnkz0sd"
                     ,"el",local_88,0x21);
  if (iVar2 == 0) {
    iVar2 = wally_hex_from_bytes(local_88,0x21,local_e8);
    pcVar1 = local_e8[0];
    if (iVar2 != 0) goto LAB_001014ef;
    iVar2 = strcmp(local_e8[0],"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800")
    ;
    wally_free_string(pcVar1);
    if (iVar2 != 0) goto LAB_001014ef;
  }
  else {
LAB_001014ef:
    puts("check_confidential_addr_segwit_to_ec_public_key(pubkey) test failed!");
    uVar3 = 0;
  }
  local_e8[0] = (char *)0x0;
  iVar2 = wally_confidential_addr_segwit_to_ec_public_key
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
                     ,"el",local_88,0x21);
  if (iVar2 == 0) {
    iVar2 = wally_hex_from_bytes(local_88,0x21,local_e8);
    pcVar1 = local_e8[0];
    if (iVar2 == 0) {
      iVar2 = strcmp(local_e8[0],
                     "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
      wally_free_string(pcVar1);
      if (iVar2 == 0) goto LAB_00101575;
    }
  }
  puts("check_confidential_addr_segwit_to_ec_public_key(script) test failed!");
  uVar3 = 0;
LAB_00101575:
  return uVar3 ^ 1;
}

Assistant:

int main(void)
{
    bool tests_ok = true;

    if (!check_confidential_addr_from_addr_segwit_pubkey()) {
        printf("check_confidential_addr_from_addr_segwit(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_from_addr_segwit_script()) {
        printf("check_confidential_addr_from_addr_segwit(script) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_to_addr_segwit_pubkey()) {
        printf("check_confidential_addr_to_addr_segwit(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_to_addr_segwit_script()) {
        printf("check_confidential_addr_to_addr_segwit(script) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_segwit_to_ec_public_key_pubkey()) {
        printf("check_confidential_addr_segwit_to_ec_public_key(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_segwit_to_ec_public_key_script()) {
        printf("check_confidential_addr_segwit_to_ec_public_key(script) test failed!\n");
        tests_ok = false;
    }

    return tests_ok ? 0 : 1;
}